

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O0

char * rndcolor(void)

{
  boolean bVar1;
  int iVar2;
  char *local_20;
  char *local_18;
  int k;
  
  iVar2 = rn2(0x10);
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_001a9e1d:
    if (iVar2 == 8) {
      local_20 = "colorless";
    }
    else {
      local_20 = c_obj_colors[iVar2];
    }
    local_18 = local_20;
  }
  else {
    if (u.umonnum != u.umonster) {
      bVar1 = dmgtype(youmonst.data,0x24);
      if (bVar1 != '\0') goto LAB_001a9e1d;
    }
    local_18 = hcolor((char *)0x0);
  }
  return local_18;
}

Assistant:

const char *rndcolor(void)
{
	int k = rn2(CLR_MAX);
	return Hallucination ? hcolor(NULL) : (k == NO_COLOR) ?
		"colorless" : c_obj_colors[k];
}